

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteDTDExternalEntity
              (xmlTextWriterPtr writer,int pe,xmlChar *name,xmlChar *pubid,xmlChar *sysid,
              xmlChar *ndataid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = -1;
  if ((pubid != (xmlChar *)0x0 || sysid != (xmlChar *)0x0) && (pe == 0 || ndataid == (xmlChar *)0x0)
     ) {
    iVar1 = xmlTextWriterStartDTDEntity(writer,pe,name);
    if (iVar1 != -1) {
      iVar2 = xmlTextWriterWriteDTDExternalEntityContents(writer,pubid,sysid,ndataid);
      if (-1 < iVar2) {
        iVar3 = xmlTextWriterEndDTDEntity(writer);
        if (iVar3 != -1) {
          iVar4 = iVar2 + iVar1 + iVar3;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlTextWriterWriteDTDExternalEntity(xmlTextWriterPtr writer,
                                    int pe,
                                    const xmlChar * name,
                                    const xmlChar * pubid,
                                    const xmlChar * sysid,
                                    const xmlChar * ndataid)
{
    int count;
    int sum;

    if (((pubid == NULL) && (sysid == NULL)))
        return -1;
    if ((pe != 0) && (ndataid != NULL))
        return -1;

    sum = 0;
    count = xmlTextWriterStartDTDEntity(writer, pe, name);
    if (count == -1)
        return -1;
    sum += count;

    count =
        xmlTextWriterWriteDTDExternalEntityContents(writer, pubid, sysid,
                                                    ndataid);
    if (count < 0)
        return -1;
    sum += count;

    count = xmlTextWriterEndDTDEntity(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}